

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  curl_proxytype cVar1;
  Curl_easy *data;
  CURLcode CVar2;
  long lVar3;
  long port;
  char *pcVar4;
  saslstate sVar5;
  char *service;
  char *resp;
  size_t len;
  char *chlg;
  char *serverdata;
  size_t chlglen;
  char *local_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  ntlmdata *local_40;
  size_t local_38;
  
  data = conn->data;
  local_60 = (char *)0x0;
  cVar1 = (conn->http_proxy).proxytype;
  if ((cVar1 != CURLPROXY_HTTPS) ||
     (lVar3 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
    lVar3 = 0xd8;
  }
  if ((cVar1 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    port = conn->port;
  }
  else {
    port = (long)conn->remote_port;
  }
  pcVar4 = *(char **)((conn->chunk).hexbuffer + lVar3 + -0x20);
  local_50 = (char *)0x0;
  local_38 = 0;
  service = (data->set).str[0x32];
  if (service == (char *)0x0) {
    service = sasl->params->service;
  }
  local_58 = 0;
  *progress = SASL_INPROGRESS;
  sVar5 = sasl->state;
  if (sVar5 == SASL_OAUTH2_RESP) {
switchD_0013a68a_caseD_e:
    if (sasl->params->finalcode == code) {
      *progress = SASL_DONE;
      sasl->state = SASL_STOP;
      return CURLE_OK;
    }
    if (sasl->params->contcode != code) {
LAB_0013a701:
      *progress = SASL_DONE;
      sasl->state = SASL_STOP;
      return CURLE_LOGIN_DENIED;
    }
    pcVar4 = "AQ==";
LAB_0013a6e8:
    local_60 = (*Curl_cstrdup)(pcVar4);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (local_60 != (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    goto LAB_0013a974;
  }
  if (sVar5 == SASL_CANCEL) {
switchD_0013a68a_caseD_f:
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar2 = Curl_sasl_start(sasl,conn,sasl->force_ir,progress);
    sVar5 = sasl->state;
    goto LAB_0013a97a;
  }
  if (sVar5 == SASL_FINAL) {
    CVar2 = CURLE_LOGIN_DENIED;
    if (sasl->params->finalcode == code) {
      CVar2 = CURLE_OK;
    }
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CVar2;
  }
  if (sasl->params->contcode != code) goto LAB_0013a701;
  switch(sVar5) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    CVar2 = Curl_auth_create_plain_message(data,conn->user,conn->passwd,&local_60,&local_58);
    break;
  case SASL_LOGIN:
    CVar2 = Curl_auth_create_login_message(data,conn->user,&local_60,&local_58);
    sVar5 = SASL_LOGIN_PASSWD;
    goto LAB_0013a97a;
  case SASL_LOGIN_PASSWD:
    CVar2 = Curl_auth_create_login_message(data,conn->passwd,&local_60,&local_58);
    break;
  case SASL_EXTERNAL:
    CVar2 = Curl_auth_create_external_message(data,conn->user,&local_60,&local_58);
    break;
  case SASL_CRAMMD5:
    (*sasl->params->getmessage)((data->state).buffer,&local_48);
    CVar2 = Curl_auth_decode_cram_md5_message(local_48,&local_50,&local_38);
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_auth_create_cram_md5_message
                        (data,local_50,conn->user,conn->passwd,&local_60,&local_58);
    }
    (*Curl_cfree)(local_50);
    break;
  case SASL_DIGESTMD5:
    (*sasl->params->getmessage)((data->state).buffer,&local_48);
    CVar2 = Curl_auth_create_digest_md5_message
                      (data,local_48,conn->user,conn->passwd,service,&local_60,&local_58);
    sVar5 = SASL_DIGESTMD5_RESP;
    goto LAB_0013a97a;
  case SASL_DIGESTMD5_RESP:
    pcVar4 = "";
    goto LAB_0013a6e8;
  case SASL_NTLM:
    CVar2 = Curl_auth_create_ntlm_type1_message
                      (data,conn->user,conn->passwd,&conn->ntlm,&local_60,&local_58);
    sVar5 = SASL_NTLM_TYPE2MSG;
    goto LAB_0013a97a;
  case SASL_NTLM_TYPE2MSG:
    (*sasl->params->getmessage)((data->state).buffer,&local_48);
    local_40 = &conn->ntlm;
    CVar2 = Curl_auth_decode_ntlm_type2_message(data,local_48,local_40);
    sVar5 = SASL_FINAL;
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_auth_create_ntlm_type3_message
                        (data,conn->user,conn->passwd,local_40,&local_60,&local_58);
    }
    goto LAB_0013a97a;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case SASL_OAUTH2:
    if (sasl->authused == 0x100) {
      CVar2 = Curl_auth_create_oauth_bearer_message
                        (data,conn->user,pcVar4,port,conn->oauth_bearer,&local_60,&local_58);
      sVar5 = SASL_OAUTH2_RESP;
      goto LAB_0013a97a;
    }
    CVar2 = Curl_auth_create_oauth_bearer_message
                      (data,conn->user,(char *)0x0,0,conn->oauth_bearer,&local_60,&local_58);
    break;
  case SASL_OAUTH2_RESP:
    goto switchD_0013a68a_caseD_e;
  case SASL_CANCEL:
    goto switchD_0013a68a_caseD_f;
  }
LAB_0013a974:
  sVar5 = SASL_FINAL;
LAB_0013a97a:
  if (CVar2 == CURLE_OK) {
    if (local_60 == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      CVar2 = (*sasl->params->sendcont)(conn,local_60);
    }
  }
  else if (CVar2 == CURLE_BAD_CONTENT_ENCODING) {
    CVar2 = (*sasl->params->sendcont)(conn,"*");
    sVar5 = SASL_CANCEL;
  }
  else {
    *progress = SASL_DONE;
    sVar5 = SASL_STOP;
  }
  (*Curl_cfree)(local_60);
  sasl->state = sVar5;
  return CVar2;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
  const char * const hostname = SSL_IS_PROXY() ? conn->http_proxy.host.name :
    conn->host.name;
  const long int port = SSL_IS_PROXY() ? conn->port : conn->remote_port;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
#if !defined(CURL_DISABLE_CRYPTO_AUTH) || defined(USE_KERBEROS5)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
                        data->set.str[STRING_SERVICE_NAME] :
                        sasl->params->service;
#endif
#if !defined(CURL_DISABLE_CRYPTO_AUTH) || defined(USE_KERBEROS5) || \
    defined(USE_NTLM)
  char *serverdata;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && sasl->state != SASL_OAUTH2_RESP &&
     code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = Curl_auth_create_plain_message(data, conn->user, conn->passwd,
                                            &resp,
                                            &len);
    break;
  case SASL_LOGIN:
    result = Curl_auth_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = Curl_auth_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = Curl_auth_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = Curl_auth_create_cram_md5_message(data, chlg, conn->user,
                                                 conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    resp = strdup("");
    if(!resp)
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data,
                                                 conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_auth_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_auth_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  service,
                                                  data->easy_conn->host.name,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_auth_create_gssapi_user_message(data, NULL, NULL,
                                                    NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_auth_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_OAUTH2:
    /* Create the authorisation message */
    if(sasl->authused == SASL_MECH_OAUTHBEARER) {
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     hostname,
                                                     port,
                                                     conn->oauth_bearer,
                                                     &resp, &len);

      /* Failures maybe sent by the server as continuations for OAUTHBEARER */
      newstate = SASL_OAUTH2_RESP;
    }
    else
      result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                     NULL, 0,
                                                     conn->oauth_bearer,
                                                     &resp, &len);
    break;

  case SASL_OAUTH2_RESP:
    /* The continuation is optional so check the response code */
    if(code == sasl->params->finalcode) {
      /* Final response was received so we are done */
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return result;
    }
    else if(code == sasl->params->contcode) {
      /* Acknowledge the continuation by sending a 0x01 response base64
         encoded */
      resp = strdup("AQ==");
      if(!resp)
        result = CURLE_OUT_OF_MEMORY;
      break;
    }
    else {
      *progress = SASL_DONE;
      state(sasl, conn, SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }

  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}